

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O3

void __thiscall QBoxLayoutPrivate::setupGeom(QBoxLayoutPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Direction DVar5;
  QLayout *this_00;
  qsizetype qVar6;
  QBoxLayoutItem *this_01;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  QFlagsStorageHelper<QSizePolicy::ControlType,_4> QVar17;
  uint uVar18;
  uint uVar19;
  uint extraout_var;
  uint extraout_var_00;
  uint extraout_var_01;
  undefined4 extraout_var_02;
  QWidget *pQVar20;
  pointer pQVar21;
  QSize QVar22;
  bool bVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  QFlagsStorage<QSizePolicy::ControlType> controls2;
  long in_FS_OFFSET;
  bool bVar31;
  int iVar32;
  uint local_104;
  uint local_100;
  uint local_f8;
  QFlagsStorage<QSizePolicy::ControlType> local_e0;
  uint local_dc;
  QStyle *local_a8;
  QArrayDataPointer<QLayoutStruct> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x118 & 2) != 0) {
    this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
    uVar11 = 0;
    bVar31 = this->dir < Down;
    uVar18 = 0x7ffff;
    if (bVar31) {
      uVar18 = 0;
    }
    uVar19 = 0x7ffff;
    if (!bVar31) {
      uVar19 = 0;
    }
    qVar6 = (this->list).d.size;
    this->field_0x118 = this->field_0x118 & 0xfe;
    QList<QLayoutStruct>::clear(&this->geomArray);
    uVar26 = (uint)qVar6;
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_58,(long)(int)uVar26);
    iVar10 = (**(code **)(*(long *)this_00 + 0x60))(this_00);
    if ((iVar10 < 0) && (pQVar20 = QLayout::parentWidget(this_00), pQVar20 != (QWidget *)0x0)) {
      local_a8 = QWidget::style(pQVar20);
    }
    else {
      local_a8 = (QStyle *)0x0;
    }
    if ((int)uVar26 < 1) {
      uVar26 = 0;
      local_100 = 0;
      local_104 = 0;
      uVar25 = 0;
      uVar28 = 0;
    }
    else {
      local_f8 = 0xffffffff;
      lVar30 = 0;
      uVar28 = 0;
      local_dc = 0;
      uVar25 = 0;
      local_104 = 0;
      local_100 = 0;
      bVar8 = 0;
      bVar9 = 0;
      local_e0.i = 0;
      do {
        this_01 = *(QBoxLayoutItem **)((long)(this->list).d.ptr + lVar30);
        uVar11 = (*this_01->item->_vptr_QLayoutItem[4])();
        uVar12 = (*this_01->item->_vptr_QLayoutItem[3])();
        uVar13 = (*this_01->item->_vptr_QLayoutItem[2])();
        uVar14 = (*this_01->item->_vptr_QLayoutItem[5])();
        iVar15 = (*this_01->item->_vptr_QLayoutItem[8])();
        if (SUB41(iVar15,0) == false) {
          uVar27 = (uint)uVar28;
          if (iVar10 < 0) {
            QVar17.super_QFlagsStorage<QSizePolicy::ControlType>.i =
                 (QFlagsStorage<QSizePolicy::ControlType>)
                 (*this_01->item->_vptr_QLayoutItem[0x10])();
            if (-1 < (int)local_f8) {
              DVar5 = this->dir;
              controls2.i = (Int)QVar17.super_QFlagsStorage<QSizePolicy::ControlType>.i;
              if ((DVar5 | Down) == BottomToTop) {
                controls2.i = local_e0.i;
                local_e0.i = (Int)QVar17.super_QFlagsStorage<QSizePolicy::ControlType>.i;
              }
              if (local_a8 == (QStyle *)0x0) {
                local_e0.i = (Int)QVar17.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                iVar16 = 0;
              }
              else {
                pQVar20 = QLayout::parentWidget(this_00);
                iVar16 = QStyle::combinedLayoutSpacing
                                   (local_a8,(ControlTypes)local_e0.i,(ControlTypes)controls2.i,
                                    Vertical - (DVar5 < Down),(QStyleOption *)0x0,pQVar20);
                local_e0.i = (Int)QVar17.super_QFlagsStorage<QSizePolicy::ControlType>.i;
                if (iVar16 < 1) {
                  iVar16 = 0;
                }
              }
              goto LAB_002c962e;
            }
            iVar32 = 0;
            bVar31 = false;
            local_f8 = uVar27;
            local_e0.i = (Int)QVar17.super_QFlagsStorage<QSizePolicy::ControlType>.i;
          }
          else {
            iVar32 = 0;
            iVar16 = iVar10;
            if ((int)local_f8 < 0) {
              bVar31 = false;
              local_f8 = uVar27;
            }
            else {
LAB_002c962e:
              iVar32 = iVar16;
              pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
              pQVar21[local_f8].spacing = iVar32;
              bVar31 = false;
              local_f8 = uVar27;
            }
          }
        }
        else {
          iVar16 = (*this_01->item->_vptr_QLayoutItem[0xd])();
          bVar31 = CONCAT44(extraout_var_02,iVar16) != 0;
          iVar32 = 0;
        }
        bVar24 = (byte)uVar14;
        if (this->dir < Down) {
          bVar23 = true;
          if ((uVar14 & 1) == 0) {
            bVar23 = 0 < this_01->stretch;
          }
          if (!bVar31) {
            iVar16 = (*this_01->item->_vptr_QLayoutItem[8])();
            if (bVar9 == 0) {
              bVar7 = (byte)iVar16 ^ 1;
              uVar27 = extraout_var;
              if ((((uVar19 != 0 && bVar7 == 0) && (char)((uVar14 & 2) >> 1) == '\0') &&
                  (uVar27 = uVar19, bVar7 == 0)) &&
                 (uVar27 = extraout_var, (int)uVar19 < (int)extraout_var)) {
                uVar27 = uVar19;
              }
            }
            else {
              uVar27 = uVar19;
              if (((uVar14 & 2) != 0) && (uVar27 = extraout_var, (int)extraout_var < (int)uVar19)) {
                uVar27 = uVar19;
              }
            }
            bVar9 = bVar24 >> 1 & 1 | bVar9;
            uVar19 = uVar27;
          }
          bVar8 = bVar8 | bVar23;
          uVar18 = uVar18 + uVar11 + iVar32;
          local_dc = local_dc + uVar12 + iVar32;
          local_104 = local_104 + uVar13 + iVar32;
          if ((int)uVar25 <= (int)extraout_var_00) {
            uVar25 = extraout_var_00;
          }
          if ((int)local_100 <= (int)extraout_var_01) {
            local_100 = extraout_var_01;
          }
          pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar21->sizeHint)[lVar30] = uVar13;
          pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar21->maximumSize)[lVar30] = uVar11;
          pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar21->minimumSize)[lVar30] = uVar12;
          pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar21->expansive)[lVar30 * 4] = bVar23;
          iVar16 = this_01->stretch;
          if (iVar16 == 0) {
            iVar16 = QBoxLayoutItem::hStretch(this_01);
          }
        }
        else {
          bVar23 = true;
          if ((uVar14 & 2) == 0) {
            bVar23 = 0 < this_01->stretch;
          }
          if (!bVar31) {
            iVar16 = (*this_01->item->_vptr_QLayoutItem[8])();
            uVar27 = uVar18;
            if (bVar8 == 0) {
              bVar7 = (byte)iVar16 ^ 1;
              uVar27 = uVar11;
              if (((((uVar18 == 0 | bVar24 | bVar7) & 1) == 0) && (uVar27 = uVar18, bVar7 == 0)) &&
                 ((int)uVar11 <= (int)uVar18)) {
                uVar27 = uVar11;
              }
            }
            else if (((uVar14 & 1) != 0) && ((int)uVar18 <= (int)uVar11)) {
              uVar27 = uVar11;
            }
            uVar18 = uVar27;
            bVar8 = bVar8 | bVar24 & 1;
          }
          bVar9 = bVar9 | bVar23;
          uVar19 = uVar19 + extraout_var + iVar32;
          uVar25 = uVar25 + extraout_var_00 + iVar32;
          local_100 = local_100 + extraout_var_01 + iVar32;
          if ((int)local_dc <= (int)uVar12) {
            local_dc = uVar12;
          }
          if ((int)local_104 <= (int)uVar13) {
            local_104 = uVar13;
          }
          pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar21->sizeHint)[lVar30] = extraout_var_01;
          pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar21->maximumSize)[lVar30] = extraout_var;
          pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar21->minimumSize)[lVar30] = extraout_var_00;
          pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
          (&pQVar21->expansive)[lVar30 * 4] = bVar23;
          iVar16 = this_01->stretch;
          if (iVar16 == 0) {
            iVar16 = QBoxLayoutItem::vStretch(this_01);
          }
        }
        pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
        (&pQVar21->stretch)[lVar30] = iVar16;
        pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
        (&pQVar21->empty)[lVar30 * 4] = SUB41(iVar15,0);
        pQVar21 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
        (&pQVar21->spacing)[lVar30] = 0;
        bVar24 = this->field_0x118;
        bVar7 = 1;
        if ((bVar24 & 1) == 0) {
          iVar15 = (*this_01->item->_vptr_QLayoutItem[9])();
          bVar7 = (byte)iVar15;
          bVar24 = this->field_0x118;
        }
        this->field_0x118 = bVar24 & 0xfe | bVar7;
        uVar28 = uVar28 + 1;
        lVar30 = lVar30 + 8;
      } while ((uVar26 & 0x7fffffff) != uVar28);
      uVar26 = (uint)bVar8;
      uVar11 = (uint)bVar9 * 2;
      uVar28 = (ulong)local_dc;
    }
    QArrayDataPointer<QLayoutStruct>::operator=(&(this->geomArray).d,&local_58);
    QVar22 = (QSize)((ulong)uVar25 << 0x20 | uVar28);
    uVar29 = (ulong)uVar18;
    if ((int)uVar18 <= (int)uVar28) {
      uVar29 = uVar28;
    }
    if ((int)uVar19 <= (int)uVar25) {
      uVar19 = uVar25;
    }
    if ((int)uVar28 < (int)local_104) {
      uVar28 = (ulong)local_104;
    }
    (this->expanding).super_QFlagsStorageHelper<Qt::Orientation,_4>.
    super_QFlagsStorage<Qt::Orientation>.i = uVar11 | uVar26;
    if ((int)uVar25 < (int)local_100) {
      uVar25 = local_100;
    }
    this->minSize = QVar22;
    if ((int)uVar29 <= (int)uVar28) {
      uVar28 = uVar29;
    }
    if ((int)uVar19 <= (int)uVar25) {
      uVar25 = uVar19;
    }
    this->maxSize = (QSize)(uVar29 + ((ulong)uVar19 << 0x20));
    this->sizeHint = (QSize)(uVar28 | (ulong)uVar25 << 0x20);
    QLayout::getContentsMargins
              (this_00,&this->leftMargin,&this->topMargin,&this->rightMargin,&this->bottomMargin);
    uVar1 = this->rightMargin;
    uVar3 = this->bottomMargin;
    uVar2 = this->leftMargin;
    uVar4 = this->topMargin;
    iVar16 = uVar2 + uVar1;
    iVar32 = uVar4 + uVar3;
    QVar22.wd.m_i = (this->maxSize).wd.m_i + iVar16;
    QVar22.ht.m_i = (this->maxSize).ht.m_i + iVar32;
    this->maxSize = QVar22;
    iVar10 = (this->minSize).wd.m_i;
    iVar15 = (this->minSize).ht.m_i;
    (this->sizeHint).wd.m_i = (this->sizeHint).wd.m_i + iVar16;
    (this->sizeHint).ht.m_i = (this->sizeHint).ht.m_i + iVar32;
    (this->minSize).wd.m_i = iVar10 + iVar16;
    (this->minSize).ht.m_i = iVar15 + iVar32;
    this->field_0x118 = this->field_0x118 & 0xfd;
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,0x20,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBoxLayoutPrivate::setupGeom()
{
    if (!dirty)
        return;

    Q_Q(QBoxLayout);
    int maxw = horz(dir) ? 0 : QLAYOUTSIZE_MAX;
    int maxh = horz(dir) ? QLAYOUTSIZE_MAX : 0;
    int minw = 0;
    int minh = 0;
    int hintw = 0;
    int hinth = 0;

    bool horexp = false;
    bool verexp = false;

    hasHfw = false;

    int n = list.size();
    geomArray.clear();
    QList<QLayoutStruct> a(n);

    QSizePolicy::ControlTypes controlTypes1;
    QSizePolicy::ControlTypes controlTypes2;
    int fixedSpacing = q->spacing();
    int previousNonEmptyIndex = -1;

    QStyle *style = nullptr;
    if (fixedSpacing < 0) {
        if (QWidget *parentWidget = q->parentWidget())
            style = parentWidget->style();
    }

    for (int i = 0; i < n; i++) {
        QBoxLayoutItem *box = list.at(i);
        QSize max = box->item->maximumSize();
        QSize min = box->item->minimumSize();
        QSize hint = box->item->sizeHint();
        Qt::Orientations exp = box->item->expandingDirections();
        bool empty = box->item->isEmpty();
        int spacing = 0;

        if (!empty) {
            if (fixedSpacing >= 0) {
                spacing = (previousNonEmptyIndex >= 0) ? fixedSpacing : 0;
#ifdef Q_OS_MAC
                if (!horz(dir) && previousNonEmptyIndex >= 0) {
                    QBoxLayoutItem *sibling = (dir == QBoxLayout::TopToBottom  ? box : list.at(previousNonEmptyIndex));
                    if (sibling) {
                        QWidget *wid = sibling->item->widget();
                        if (wid)
                            spacing = qMax(spacing, sibling->item->geometry().top() - wid->geometry().top());
                    }
                }
#endif
            } else {
                controlTypes1 = controlTypes2;
                controlTypes2 = box->item->controlTypes();
                if (previousNonEmptyIndex >= 0) {
                    QSizePolicy::ControlTypes actual1 = controlTypes1;
                    QSizePolicy::ControlTypes actual2 = controlTypes2;
                    if (dir == QBoxLayout::RightToLeft || dir == QBoxLayout::BottomToTop)
                        qSwap(actual1, actual2);

                    if (style) {
                        spacing = style->combinedLayoutSpacing(actual1, actual2,
                                             horz(dir) ? Qt::Horizontal : Qt::Vertical,
                                             nullptr, q->parentWidget());
                        if (spacing < 0)
                            spacing = 0;
                    }
                }
            }

            if (previousNonEmptyIndex >= 0)
                a[previousNonEmptyIndex].spacing = spacing;
            previousNonEmptyIndex = i;
        }

        bool ignore = empty && box->item->widget(); // ignore hidden widgets
        bool dummy = true;
        if (horz(dir)) {
            bool expand = (exp & Qt::Horizontal || box->stretch > 0);
            horexp = horexp || expand;
            maxw += spacing + max.width();
            minw += spacing + min.width();
            hintw += spacing + hint.width();
            if (!ignore)
                qMaxExpCalc(maxh, verexp, dummy,
                            max.height(), exp & Qt::Vertical, box->item->isEmpty());
            minh = qMax(minh, min.height());
            hinth = qMax(hinth, hint.height());

            a[i].sizeHint = hint.width();
            a[i].maximumSize = max.width();
            a[i].minimumSize = min.width();
            a[i].expansive = expand;
            a[i].stretch = box->stretch ? box->stretch : box->hStretch();
        } else {
            bool expand = (exp & Qt::Vertical || box->stretch > 0);
            verexp = verexp || expand;
            maxh += spacing + max.height();
            minh += spacing + min.height();
            hinth += spacing + hint.height();
            if (!ignore)
                qMaxExpCalc(maxw, horexp, dummy,
                            max.width(), exp & Qt::Horizontal, box->item->isEmpty());
            minw = qMax(minw, min.width());
            hintw = qMax(hintw, hint.width());

            a[i].sizeHint = hint.height();
            a[i].maximumSize = max.height();
            a[i].minimumSize = min.height();
            a[i].expansive = expand;
            a[i].stretch = box->stretch ? box->stretch : box->vStretch();
        }

        a[i].empty = empty;
        a[i].spacing = 0;   // might be initialized with a non-zero value in a later iteration
        hasHfw = hasHfw || box->item->hasHeightForWidth();
    }

    geomArray = a;

    expanding = (Qt::Orientations)
                       ((horexp ? Qt::Horizontal : 0)
                         | (verexp ? Qt::Vertical : 0));

    minSize = QSize(minw, minh);
    maxSize = QSize(maxw, maxh).expandedTo(minSize);
    sizeHint = QSize(hintw, hinth).expandedTo(minSize).boundedTo(maxSize);

    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);
    int left, top, right, bottom;
    effectiveMargins(&left, &top, &right, &bottom);
    QSize extra(left + right, top + bottom);

    minSize += extra;
    maxSize += extra;
    sizeHint += extra;

    dirty = false;
}